

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard.cpp
# Opt level: O3

string * __thiscall xcard::generateCard_abi_cxx11_(string *__return_storage_ptr__,xcard *this)

{
  char *__nptr;
  ulong uVar1;
  pointer pcVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  result_type __val;
  int *piVar8;
  long lVar9;
  undefined8 uVar10;
  uint uVar11;
  result_type rVar12;
  int iVar13;
  string __str;
  string cardbuf;
  default_random_engine generator;
  uniform_int_distribution<unsigned_int> dist;
  random_device rd;
  char *local_1410;
  uint local_1408;
  char local_1400 [16];
  undefined1 *local_13f0;
  long local_13e8;
  undefined1 local_13e0 [16];
  long local_13d0;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13c8;
  param_type local_13c0;
  random_device local_13b8;
  
  local_13f0 = local_13e0;
  local_13e8 = 0;
  local_13e0[0] = 0;
  std::random_device::random_device(&local_13b8);
  uVar6 = std::random_device::_M_getval();
  uVar11 = uVar6 / 0x7fffffff << 0x1f | uVar6 / 0x7fffffff;
  local_13c8._M_x = (unsigned_long)(uVar11 + uVar6 + (uint)(uVar6 + uVar11 == 0));
  __nptr = (this->prefix)._M_dataplus._M_p;
  piVar8 = __errno_location();
  iVar13 = *piVar8;
  *piVar8 = 0;
  lVar9 = strtoll(__nptr,&local_1410,10);
  if (local_1410 == __nptr) {
    uVar10 = std::__throw_invalid_argument("stoll");
    __clang_call_terminate(uVar10);
  }
  if (*piVar8 != 0) {
    if (*piVar8 != 0x22) goto LAB_001049f2;
    lVar9 = std::__throw_out_of_range("stoll");
  }
  *piVar8 = iVar13;
LAB_001049f2:
  if (-1 < lVar9) {
    std::__cxx11::string::replace
              ((ulong)&local_13f0,0,(char *)0x0,(ulong)(this->prefix)._M_dataplus._M_p);
  }
  local_13c0._M_a = 0;
  local_13c0._M_b = 9;
  iVar7 = 0x10 - (int)local_13e8;
  iVar13 = 1;
  if (1 < iVar7) {
    iVar13 = iVar7;
  }
  local_13d0 = local_13e8;
  do {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_13f0,local_13f0 + local_13e8);
    if ((int)local_13d0 < 0x10) {
      iVar7 = 0;
      do {
        uVar1 = __return_storage_ptr__->_M_string_length;
        __val = std::uniform_int_distribution<unsigned_int>::operator()
                          ((uniform_int_distribution<unsigned_int> *)&local_13c0,&local_13c8,
                           &local_13c0);
        cVar4 = '\x01';
        if (9 < __val) {
          rVar12 = __val;
          cVar3 = '\x04';
          do {
            cVar4 = cVar3;
            if (rVar12 < 100) {
              cVar4 = cVar4 + -2;
              goto LAB_00104ad5;
            }
            if (rVar12 < 1000) {
              cVar4 = cVar4 + -1;
              goto LAB_00104ad5;
            }
            if (rVar12 < 10000) goto LAB_00104ad5;
            bVar5 = 99999 < rVar12;
            rVar12 = rVar12 / 10000;
            cVar3 = cVar4 + '\x04';
          } while (bVar5);
          cVar4 = cVar4 + '\x01';
        }
LAB_00104ad5:
        local_1410 = local_1400;
        std::__cxx11::string::_M_construct((ulong)&local_1410,cVar4);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_1410,local_1408,__val);
        std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,uVar1,(char *)0x0,(ulong)local_1410);
        if (local_1410 != local_1400) {
          operator_delete(local_1410);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar13);
    }
    bVar5 = LuhnCheck(this,__return_storage_ptr__);
    if (bVar5) {
      std::random_device::_M_fini();
      if (local_13f0 != local_13e0) {
        operator_delete(local_13f0);
      }
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &__return_storage_ptr__->field_2) {
      operator_delete(pcVar2);
    }
  } while( true );
}

Assistant:

std::string xcard::generateCard()
{

    std::string cardbuf;

    /* Seed */
    std::random_device rd;

    /* Random number generator */
    std::default_random_engine generator(rd());

    if (std::stoll(this->prefix) > -1)
    {
        cardbuf.insert(0, this->prefix);
    }

    std::uniform_int_distribution<unsigned int> dist(0, 9);

    int initial_length = cardbuf.length();
    int genreq = 16 - initial_length;

    while (true)
    {

        std::string cc = cardbuf;
        
        for (int i = 0; i < genreq; i++)
        {
            cc.insert(cc.length(), std::to_string(dist(generator)));
        }

        if (LuhnCheck(cc) == true)
        {
            return cc;
        }
    }
}